

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O2

void __thiscall soplex::SoPlexBase<double>::_verifyObjLimitReal(SoPlexBase<double> *this)

{
  Verbosity VVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  SPxOut *pSVar6;
  SPxOut *pSVar7;
  Verbosity old_verbosity;
  Real RVar8;
  double redcostviol;
  double dualviol;
  double sumviol;
  double local_40;
  double local_38;
  double local_30;
  
  pSVar7 = &this->spxout;
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    pSVar6 = soplex::operator<<(pSVar7," --- verifying objective limit");
    std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
    (this->spxout).m_verbosity = VVar1;
  }
  local_30 = 0.0;
  local_38 = 0.0;
  local_40 = 0.0;
  bVar4 = getDualViolation(this,&local_38,&local_30);
  bVar5 = getRedCostViolation(this,&local_40,&local_30);
  dVar3 = local_38;
  if ((((bVar4) && (bVar5)) &&
      (RVar8 = Tolerances::floatingPointOpttol
                         ((this->_solver).super_SPxLPBase<double>._tolerances.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      , dVar2 = local_40, dVar3 < RVar8)) &&
     (RVar8 = Tolerances::floatingPointOpttol
                        ((this->_solver).super_SPxLPBase<double>._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr),
     dVar2 < RVar8)) {
    return;
  }
  VVar1 = (this->spxout).m_verbosity;
  if ((int)VVar1 < 5) {
    if ((int)VVar1 < 3) goto LAB_002bde0d;
  }
  else {
    (this->spxout).m_verbosity = INFO3;
    pSVar6 = soplex::operator<<(pSVar7,", dual violation: ");
    pSVar6 = soplex::operator<<(pSVar6,local_38);
    pSVar6 = soplex::operator<<(pSVar6,", redcost violation: ");
    pSVar6 = soplex::operator<<(pSVar6,local_40);
    std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
  }
  (this->spxout).m_verbosity = INFO1;
  pSVar7 = soplex::operator<<(pSVar7,
                              " --- detected violations in original problem space -- solve again without presolving/scaling"
                             );
  std::endl<char,std::char_traits<char>>(pSVar7->m_streams[pSVar7->m_verbosity]);
  (this->spxout).m_verbosity = VVar1;
LAB_002bde0d:
  if (this->_simplifier == (SPxSimplifier<double> *)0x0 && this->_scaler == (SPxScaler<double> *)0x0
     ) {
    (this->_solver).useTerminationValue = false;
  }
  else if (this->_isRealLPScaled == true) {
    SPxSolverBase<double>::unscaleLPandReloadBasis(&this->_solver);
    this->_isRealLPScaled = false;
    this->_unscaleCalls = this->_unscaleCalls + 1;
  }
  _preprocessAndSolveReal(this,false,(bool *)0x0);
  return;
}

Assistant:

void SoPlexBase<R>::_verifyObjLimitReal()
{
   SPX_MSG_INFO1(spxout, spxout << " --- verifying objective limit" << std::endl;)

   R sumviol = 0;
   R dualviol = 0;
   R redcostviol = 0;

   bool dualfeasible = true;

   if(!getDualViolation(dualviol, sumviol))
      dualfeasible = false;

   if(!getRedCostViolation(redcostviol, sumviol))
      dualfeasible = false;

   if(!dualfeasible || dualviol >= _solver.tolerances()->floatingPointOpttol()
         || redcostviol >= _solver.tolerances()->floatingPointOpttol())
   {
      assert(&_solver == _realLP);
      assert(_isRealLPLoaded);
      SPX_MSG_INFO3(spxout, spxout << ", dual violation: " << dualviol
                    << ", redcost violation: " << redcostviol << std::endl;)
      SPX_MSG_INFO1(spxout, spxout <<
                    " --- detected violations in original problem space -- solve again without presolving/scaling" <<
                    std::endl;)

      // if we already disabled simplifier and scaler, next disable the objective limit
      if(_scaler == nullptr && _simplifier == nullptr)
      {
         _solver.toggleTerminationValue(false);
      }
      else if(_isRealLPScaled)
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }

      _preprocessAndSolveReal(false);
   }
}